

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O2

double gamma(double param_1)

{
  float fVar1;
  float fVar2;
  
  fVar1 = SUB84(param_1,0);
  if (fVar1 <= 0.0) {
    fVar1 = 0.0;
  }
  fVar2 = powf(fVar1 * 5.5555,0.4545);
  fVar2 = fVar2 * 84.66;
  fVar1 = 255.0;
  if (fVar2 <= 255.0) {
    fVar1 = fVar2;
  }
  return (double)(ulong)(~-(uint)(fVar2 < 0.0) & (uint)fVar1);
}

Assistant:

unsigned char
gamma (float x)
{
    //
    // Convert a floating-point pixel value to an 8-bit gamma-2.2
    // preview pixel.  (This routine is a simplified version of
    // how the exrdisplay program transforms floating-point pixel
    // values in order to display them on the screen.)
    //

    x = pow (5.5555f * max (0.f, x), 0.4545f) * 84.66f;
    return (unsigned char) IMATH_NAMESPACE::clamp (x, 0.f, 255.f);
}